

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

void __thiscall glslang::HlslParseContext::~HlslParseContext(HlslParseContext *this)

{
  (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions =
       (_func_int **)&PTR__HlslParseContext_0089b400;
  std::
  _Rb_tree<long_long,_std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>,_std::_Select1st<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>_>
  ::~_Rb_tree((_Rb_tree<long_long,_std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>,_std::_Select1st<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>_>
               *)&this->textureShadowVariant);
  std::
  _Rb_tree<glslang::TBuiltInVariable,_std::pair<const_glslang::TBuiltInVariable,_glslang::TSymbol_*>,_std::_Select1st<std::pair<const_glslang::TBuiltInVariable,_glslang::TSymbol_*>_>,_std::less<glslang::TBuiltInVariable>,_glslang::pool_allocator<std::pair<const_glslang::TBuiltInVariable,_glslang::TSymbol_*>_>_>
  ::~_Rb_tree((_Rb_tree<glslang::TBuiltInVariable,_std::pair<const_glslang::TBuiltInVariable,_glslang::TSymbol_*>,_std::_Select1st<std::pair<const_glslang::TBuiltInVariable,_glslang::TSymbol_*>_>,_std::less<glslang::TBuiltInVariable>,_glslang::pool_allocator<std::pair<const_glslang::TBuiltInVariable,_glslang::TSymbol_*>_>_>
               *)&this->builtInTessLinkageSymbols);
  std::
  _Rb_tree<glslang::HlslParseContext::tInterstageIoData,_std::pair<const_glslang::HlslParseContext::tInterstageIoData,_glslang::TVariable_*>,_std::_Select1st<std::pair<const_glslang::HlslParseContext::tInterstageIoData,_glslang::TVariable_*>_>,_std::less<glslang::HlslParseContext::tInterstageIoData>,_glslang::pool_allocator<std::pair<const_glslang::HlslParseContext::tInterstageIoData,_glslang::TVariable_*>_>_>
  ::~_Rb_tree((_Rb_tree<glslang::HlslParseContext::tInterstageIoData,_std::pair<const_glslang::HlslParseContext::tInterstageIoData,_glslang::TVariable_*>,_std::_Select1st<std::pair<const_glslang::HlslParseContext::tInterstageIoData,_glslang::TVariable_*>_>,_std::less<glslang::HlslParseContext::tInterstageIoData>,_glslang::pool_allocator<std::pair<const_glslang::HlslParseContext::tInterstageIoData,_glslang::TVariable_*>_>_>
               *)&this->splitBuiltIns);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_bool>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_bool>_>_>
               *)&this->structBufferCounter);
  std::
  _Rb_tree<long_long,_std::pair<const_long_long,_glslang::TVariable_*>,_std::_Select1st<std::pair<const_long_long,_glslang::TVariable_*>_>,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::TVariable_*>_>_>
  ::~_Rb_tree((_Rb_tree<long_long,_std::pair<const_long_long,_glslang::TVariable_*>,_std::_Select1st<std::pair<const_long_long,_glslang::TVariable_*>_>,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::TVariable_*>_>_>
               *)&this->splitNonIoVars);
  std::
  _Rb_tree<const_glslang::TVector<glslang::TTypeLoc>_*,_std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>,_std::_Select1st<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
  ::~_Rb_tree((_Rb_tree<const_glslang::TVector<glslang::TTypeLoc>_*,_std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>,_std::_Select1st<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
               *)&this->ioTypeMap);
  std::
  _Rb_tree<long_long,_std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>,_std::_Select1st<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>_>
  ::~_Rb_tree((_Rb_tree<long_long,_std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>,_std::_Select1st<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>_>
               *)&this->flattenMap);
  std::
  _Rb_tree<long_long,_long_long,_std::_Identity<long_long>,_std::less<long_long>,_std::allocator<long_long>_>
  ::~_Rb_tree(&(this->inductiveLoopIds)._M_t);
  TParseContextBase::~TParseContextBase(&this->super_TParseContextBase);
  return;
}

Assistant:

HlslParseContext::~HlslParseContext()
{
}